

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O0

void __thiscall
dynet::BidirectionalTreeLSTMBuilder::BidirectionalTreeLSTMBuilder
          (BidirectionalTreeLSTMBuilder *this,uint layers,uint input_dim,uint hidden_dim,
          ParameterCollection *model)

{
  undefined8 *in_RDI;
  VanillaLSTMBuilder *in_R8;
  undefined1 in_stack_00000257;
  ParameterCollection *in_stack_00000258;
  uint in_stack_00000264;
  uint in_stack_00000268;
  uint in_stack_0000026c;
  VanillaLSTMBuilder *in_stack_00000270;
  VanillaLSTMBuilder *in_stack_fffffffffffffb28;
  TreeLSTMBuilder *in_stack_fffffffffffffb30;
  VanillaLSTMBuilder *in_stack_fffffffffffffb40;
  ParameterCollection *in_stack_fffffffffffffb70;
  string *in_stack_fffffffffffffd10;
  ParameterCollection *in_stack_fffffffffffffd18;
  allocator local_f1;
  string local_f0 [208];
  VanillaLSTMBuilder *local_20;
  
  local_20 = in_R8;
  TreeLSTMBuilder::TreeLSTMBuilder(in_stack_fffffffffffffb30);
  *in_RDI = &PTR__BidirectionalTreeLSTMBuilder_01049610;
  VanillaLSTMBuilder::VanillaLSTMBuilder(in_stack_fffffffffffffb40);
  VanillaLSTMBuilder::VanillaLSTMBuilder(in_stack_fffffffffffffb40);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)0xdc52cf);
  ParameterCollection::ParameterCollection(in_stack_fffffffffffffb70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"bidirectional-tree-lstm-builder",&local_f1);
  ParameterCollection::add_subcollection(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  ParameterCollection::operator=
            ((ParameterCollection *)local_20,(ParameterCollection *)in_stack_fffffffffffffb28);
  ParameterCollection::~ParameterCollection((ParameterCollection *)local_20);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  VanillaLSTMBuilder::VanillaLSTMBuilder
            (in_stack_00000270,in_stack_0000026c,in_stack_00000268,in_stack_00000264,
             in_stack_00000258,(bool)in_stack_00000257);
  VanillaLSTMBuilder::operator=(local_20,in_stack_fffffffffffffb28);
  VanillaLSTMBuilder::~VanillaLSTMBuilder(local_20);
  VanillaLSTMBuilder::VanillaLSTMBuilder
            (in_stack_00000270,in_stack_0000026c,in_stack_00000268,in_stack_00000264,
             in_stack_00000258,(bool)in_stack_00000257);
  VanillaLSTMBuilder::operator=(local_20,in_stack_fffffffffffffb28);
  VanillaLSTMBuilder::~VanillaLSTMBuilder(local_20);
  return;
}

Assistant:

BidirectionalTreeLSTMBuilder::BidirectionalTreeLSTMBuilder(unsigned layers,
                         unsigned input_dim,
                         unsigned hidden_dim,
                         ParameterCollection& model) {
  DYNET_ASSERT(hidden_dim % 2 == 0, "Failed dimension check in TreeLSTMBuilder");
  local_model = model.add_subcollection("bidirectional-tree-lstm-builder");
  fwd_node_builder = LSTMBuilder(layers, input_dim, hidden_dim / 2, local_model);
  rev_node_builder = LSTMBuilder(layers, input_dim, hidden_dim / 2, local_model);
}